

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::VirtualInterfaceTypeSyntax::setChild
          (VirtualInterfaceTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  logic_error *this_00;
  long *plVar4;
  char *func;
  size_type *psVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (4 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x35e3);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_f0 == plVar6) {
      local_e0 = *plVar6;
      lStack_d8 = plVar4[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar6;
    }
    local_e8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    lVar8 = 0x18;
    lVar7 = 0x10;
    break;
  case 1:
    lVar8 = 0x28;
    lVar7 = 0x20;
    break;
  case 2:
    lVar8 = 0x38;
    lVar7 = 0x30;
    break;
  case 3:
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar8 = 0x40;
    if (*ppSVar1 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar3 = *ppSVar1;
      if (pSVar3->kind != ParameterValueAssignment) {
        func = 
        "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ParameterValueAssignmentSyntax]";
LAB_002fed43:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,func);
      }
      goto LAB_002fed6c;
    }
    goto LAB_002fed82;
  case 4:
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar8 = 0x48;
    if (*ppSVar1 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar3 = *ppSVar1;
      if (pSVar3->kind != DotMemberClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::DotMemberClauseSyntax]";
        goto LAB_002fed43;
      }
      goto LAB_002fed6c;
    }
LAB_002fed82:
    pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    goto LAB_002fed6c;
  }
  pvVar2 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar2->info;
  *(undefined8 *)
   ((long)&(this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent + lVar7) =
       *(undefined8 *)pvVar2;
LAB_002fed6c:
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent + lVar8) =
       pSVar3;
  return;
}

Assistant:

void VirtualInterfaceTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: virtualKeyword = child.token(); return;
        case 1: interfaceKeyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 4: modport = child.node() ? &child.node()->as<DotMemberClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}